

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O3

void cusolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  ulong uVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  singlecomplex sVar6;
  singlecomplex xj;
  singlecomplex local_38;
  
  if (0 < ncol) {
    pfVar2 = &M[((ulong)(uint)ncol - 1) * (long)ldm].i;
    iVar3 = 0;
    uVar4 = (ulong)(uint)ncol;
    uVar5 = ncol;
    do {
      uVar5 = uVar5 - 1;
      c_div(&local_38,rhs + (uVar4 - 1),M + uVar4 + (long)((int)(uVar4 - 1) * ldm) + -1);
      rhs[uVar4 - 1] = local_38;
      if (1 < (long)uVar4) {
        uVar1 = 0;
        do {
          sVar6.r = rhs[uVar1].r -
                    (pfVar2[uVar1 * 2 + -1] * local_38.r + pfVar2[uVar1 * 2] * -local_38.i);
          sVar6.i = rhs[uVar1].i -
                    (pfVar2[uVar1 * 2 + -1] * local_38.i + pfVar2[uVar1 * 2] * local_38.r);
          rhs[uVar1] = sVar6;
          uVar1 = uVar1 + 1;
        } while (uVar5 != uVar1);
      }
      iVar3 = iVar3 + 1;
      pfVar2 = pfVar2 + (long)ldm * -2;
      uVar4 = uVar4 - 1;
    } while (iVar3 != ncol);
  }
  return;
}

Assistant:

void cusolve (int ldm, int ncol, singlecomplex *M, singlecomplex *rhs)
{
    singlecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	c_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    cc_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    c_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}